

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

void google::protobuf::anon_unknown_21::ValidateFeatureLifetimesImpl
               (Edition edition,Message *message,ValidationResults *results)

{
  ushort uVar1;
  FieldDescriptor *this;
  char *pcVar2;
  pointer ppFVar3;
  int number;
  Message *message_00;
  EnumDescriptor *pEVar4;
  EnumValueDescriptor *pEVar5;
  Nonnull<char_*> pcVar6;
  undefined1 *puVar7;
  ValidationResults *in_R9;
  pointer ppFVar8;
  Metadata MVar9;
  string_view full_name;
  string_view full_name_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_128;
  string local_110;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  undefined8 local_60;
  char *local_58;
  
  local_128.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MVar9 = Message::GetMetadata(message);
  Reflection::ListFields(MVar9.reflection,message,&local_128);
  ppFVar3 = local_128.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar8 = local_128.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppFVar8 == ppFVar3) {
      if (local_128.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    this = *ppFVar8;
    if (((this->field_0x1 & 8) == 0) ||
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4) != 10)) {
      pEVar4 = FieldDescriptor::enum_type(this);
      if (pEVar4 != (EnumDescriptor *)0x0) {
        MVar9 = Message::GetMetadata(message);
        number = Reflection::GetEnumValue(MVar9.reflection,message,this);
        pEVar4 = FieldDescriptor::enum_type(this);
        pEVar5 = EnumDescriptor::FindValueByNumber(pEVar4,number);
        if (pEVar5 == (EnumValueDescriptor *)0x0) {
          local_60 = 8;
          local_58 = "Feature ";
          local_90.piece_._M_str = (this->all_names_).payload_;
          local_90.piece_._M_len = (size_t)*(ushort *)(local_90.piece_._M_str + 2);
          local_90.piece_._M_str = local_90.piece_._M_str + ~local_90.piece_._M_len;
          local_c0.piece_._M_len = 0x14;
          local_c0.piece_._M_str = " has no known value ";
          pcVar2 = local_f0.digits_;
          pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer(number,pcVar2);
          local_f0.piece_._M_len = (long)pcVar6 - (long)pcVar2;
          local_f0.piece_._M_str = pcVar2;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_110,(lts_20250127 *)&local_60,&local_90,&local_c0,&local_f0,
                     (AlphaNum *)in_R9);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                     &local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00290f4e;
        }
        puVar7 = (undefined1 *)(pEVar5->options_->field_0)._impl_.feature_support_;
        if ((FieldOptions_FeatureSupport *)puVar7 == (FieldOptions_FeatureSupport *)0x0) {
          puVar7 = _FieldOptions_FeatureSupport_default_instance_;
        }
        full_name._M_str = puVar7;
        full_name._M_len = (size_t)pEVar5->all_names_[1]._M_dataplus._M_p;
        ValidateSingleFeatureLifetimes
                  ((anon_unknown_21 *)(ulong)edition,(Edition)pEVar5->all_names_[1]._M_string_length
                   ,full_name,(FeatureSupport *)results,in_R9);
      }
      puVar7 = (undefined1 *)(this->options_->field_0)._impl_.feature_support_;
      if ((FieldOptions_FeatureSupport *)puVar7 == (FieldOptions_FeatureSupport *)0x0) {
        puVar7 = _FieldOptions_FeatureSupport_default_instance_;
      }
      pcVar2 = (this->all_names_).payload_;
      uVar1 = *(ushort *)(pcVar2 + 2);
      full_name_00._M_len = pcVar2 + ~(ulong)uVar1;
      full_name_00._M_str = puVar7;
      ValidateSingleFeatureLifetimes
                ((anon_unknown_21 *)(ulong)edition,(uint)uVar1,full_name_00,
                 (FeatureSupport *)results,in_R9);
    }
    else {
      MVar9 = Message::GetMetadata(message);
      message_00 = Reflection::GetMessage(MVar9.reflection,message,this,(MessageFactory *)0x0);
      ValidateFeatureLifetimesImpl(edition,message_00,results);
    }
LAB_00290f4e:
    ppFVar8 = ppFVar8 + 1;
  } while( true );
}

Assistant:

void ValidateFeatureLifetimesImpl(Edition edition, const Message& message,
                                  FeatureResolver::ValidationResults& results) {
  std::vector<const FieldDescriptor*> fields;
  message.GetReflection()->ListFields(message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Recurse into message extension.
    if (field->is_extension() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      ValidateFeatureLifetimesImpl(
          edition, message.GetReflection()->GetMessage(message, field),
          results);
      continue;
    }

    if (field->enum_type() != nullptr) {
      int number = message.GetReflection()->GetEnumValue(message, field);
      auto value = field->enum_type()->FindValueByNumber(number);
      if (value == nullptr) {
        results.errors.emplace_back(absl::StrCat(
            "Feature ", field->full_name(), " has no known value ", number));
        continue;
      }
      ValidateSingleFeatureLifetimes(edition, value->full_name(),
                                     value->options().feature_support(),
                                     results);
    }

    ValidateSingleFeatureLifetimes(edition, field->full_name(),
                                   field->options().feature_support(), results);
  }
}